

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O2

optional<pbrt::BSDFSample> * __thiscall
pbrt::DiffuseBxDF::Sample_f
          (optional<pbrt::BSDFSample> *__return_storage_ptr__,DiffuseBxDF *this,Vector3f wo,Float uc
          ,Point2f u,TransportMode mode,BxDFReflTransFlags sampleFlags)

{
  undefined8 uVar1;
  float fVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  float fVar5;
  float fVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Float FVar10;
  Float FVar11;
  float fVar12;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar15;
  ulong in_XMM0_Qb;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar17;
  undefined1 auVar16 [56];
  undefined1 auVar14 [64];
  undefined1 auVar21 [60];
  undefined1 auVar22 [56];
  undefined1 auVar20 [64];
  undefined1 in_register_000012c8 [56];
  undefined1 auVar23 [64];
  Vector3f VVar24;
  Vector3f wo_00;
  Vector3f wi;
  Vector3f wi_00;
  SampledSpectrum SVar25;
  Tuple2<pbrt::Point2,_float> local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  ulong uStack_50;
  float local_48;
  float local_38;
  undefined1 auVar13 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  
  auVar23._8_56_ = in_register_000012c8;
  auVar23._0_8_ = u.super_Tuple2<pbrt::Point2,_float>;
  wo_00.super_Tuple3<pbrt::Vector3,_float>.z = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  local_58 = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_70 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar23._0_16_);
  uStack_50 = in_XMM0_Qb;
  FVar10 = SampledSpectrum::MaxComponentValue(&this->R);
  FVar11 = SampledSpectrum::MaxComponentValue(&this->T);
  local_48 = (float)((uint)((byte)sampleFlags & 1) * (int)FVar10);
  auVar21 = SUB6460(ZEXT864(0),0);
  local_38 = (float)((uint)((sampleFlags & Transmission) != Unset) * (int)FVar11);
  if ((((local_48 != 0.0) || (NAN(local_48))) || (local_38 != 0.0)) || (NAN(local_38))) {
    fVar2 = local_48 + local_38;
    fVar12 = local_48 / fVar2;
    uVar15 = extraout_XMM0_Dc;
    uVar17 = extraout_XMM0_Dd;
    VVar24 = SampleCosineHemisphere((Point2f *)&local_70);
    fVar5 = local_38;
    fVar6 = local_48;
    auVar18._0_4_ = VVar24.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar18._4_60_ = auVar21;
    local_68 = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar8._8_4_ = 0x80000000;
    auVar8._0_8_ = 0x8000000080000000;
    auVar8._12_4_ = 0x80000000;
    auVar8 = vxorps_avx512vl(auVar18._0_16_,auVar8);
    auVar9._8_4_ = 0x7fffffff;
    auVar9._0_8_ = 0x7fffffff7fffffff;
    auVar9._12_4_ = 0x7fffffff;
    auVar9 = vandps_avx512vl(auVar18._0_16_,auVar9);
    if (fVar12 <= uc) {
      uVar7 = vcmpss_avx512f(ZEXT816(0) << 0x40,
                             ZEXT416((uint)wo_00.super_Tuple3<pbrt::Vector3,_float>.z),1);
      bVar3 = (bool)((byte)uVar7 & 1);
      fVar12 = (float)((uint)bVar3 * auVar8._0_4_ + (uint)!bVar3 * (int)auVar18._0_4_);
      VVar24.super_Tuple3<pbrt::Vector3,_float>.z = wo_00.super_Tuple3<pbrt::Vector3,_float>.z;
      VVar24.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar15;
      VVar24.super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar17;
      auVar22 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
      auVar16 = ZEXT856(uStack_50);
      wi_00.super_Tuple3<pbrt::Vector3,_float>.z = fVar12;
      wi_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)local_68;
      wi_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)local_68 >> 0x20);
      SVar25 = f(this,VVar24,wi_00,mode);
      auVar20._0_8_ = SVar25.values.values._8_8_;
      auVar20._8_56_ = auVar22;
      auVar14._0_8_ = SVar25.values.values._0_8_;
      auVar14._8_56_ = auVar16;
      auVar8 = vmovlhps_avx(auVar14._0_16_,auVar20._0_16_);
      __return_storage_ptr__->set = true;
      uVar7 = 0x3f80000000000006;
    }
    else {
      uVar7 = vcmpss_avx512f(ZEXT416((uint)wo_00.super_Tuple3<pbrt::Vector3,_float>.z),
                             ZEXT816(0) << 0x40,1);
      bVar3 = (bool)((byte)uVar7 & 1);
      fVar12 = (float)((uint)bVar3 * auVar8._0_4_ + (uint)!bVar3 * (int)auVar18._0_4_);
      wo_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar15;
      wo_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar17;
      auVar22 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
      auVar16 = ZEXT856(uStack_50);
      wi.super_Tuple3<pbrt::Vector3,_float>.z = fVar12;
      wi.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)local_68;
      wi.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)local_68 >> 0x20);
      SVar25 = f(this,wo_00,wi,mode);
      auVar19._0_8_ = SVar25.values.values._8_8_;
      auVar19._8_56_ = auVar22;
      auVar13._0_8_ = SVar25.values.values._0_8_;
      auVar13._8_56_ = auVar16;
      auVar8 = vmovlhps_avx(auVar13._0_16_,auVar19._0_16_);
      __return_storage_ptr__->set = true;
      uVar7 = 0x3f80000000000005;
      fVar5 = fVar6;
    }
    *(undefined1 (*) [16])&__return_storage_ptr__->optionalValue = auVar8;
    auVar4._8_8_ = uStack_60;
    auVar4._0_8_ = local_68;
    uVar1 = vmovlps_avx(auVar4);
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uVar1;
    *(float *)((long)&__return_storage_ptr__->optionalValue + 0x18) = fVar12;
    *(float *)((long)&__return_storage_ptr__->optionalValue + 0x1c) =
         (auVar9._0_4_ * 0.31830987 * fVar5) / fVar2;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = uVar7;
    (__return_storage_ptr__->optionalValue).__data[0x28] = '\0';
  }
  else {
    *(undefined1 (*) [32])((long)&__return_storage_ptr__->optionalValue + 0x10) = ZEXT832(0) << 0x20
    ;
    *(undefined1 (*) [32])&__return_storage_ptr__->optionalValue = ZEXT832(0) << 0x20;
  }
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<BSDFSample> Sample_f(
        Vector3f wo, Float uc, Point2f u, TransportMode mode,
        BxDFReflTransFlags sampleFlags = BxDFReflTransFlags::All) const {
        // Compute reflection and transmission probabilities for diffuse BSDF
        Float pr = R.MaxComponentValue(), pt = T.MaxComponentValue();
        if (!(sampleFlags & BxDFReflTransFlags::Reflection))
            pr = 0;
        if (!(sampleFlags & BxDFReflTransFlags::Transmission))
            pt = 0;
        if (pr == 0 && pt == 0)
            return {};

        // Randomly sample diffuse BSDF reflection or transmission
        if (uc < pr / (pr + pt)) {
            // Sample diffuse BSDF reflection
            Vector3f wi = SampleCosineHemisphere(u);
            if (wo.z < 0)
                wi.z *= -1;
            Float pdf = CosineHemispherePDF(AbsCosTheta(wi)) * pr / (pr + pt);
            return BSDFSample(f(wo, wi, mode), wi, pdf, BxDFFlags::DiffuseReflection);

        } else {
            // Sample diffuse BSDF transmission
            Vector3f wi = SampleCosineHemisphere(u);
            if (wo.z > 0)
                wi.z *= -1;
            Float pdf = CosineHemispherePDF(AbsCosTheta(wi)) * pt / (pr + pt);
            return BSDFSample(f(wo, wi, mode), wi, pdf, BxDFFlags::DiffuseTransmission);
        }
    }